

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_ls.c
# Opt level: O0

int PSolve(sunrealtype tn,N_Vector u,N_Vector fu,N_Vector r,N_Vector z,sunrealtype gamma,
          sunrealtype delta,int lr,void *user_data)

{
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_R9;
  UserData data;
  sunrealtype *v;
  sunrealtype *zdata;
  int jy;
  int jx;
  sunindextype *(*pivot) [10];
  sunrealtype **(*P) [10];
  undefined4 local_60;
  undefined4 local_5c;
  
  lVar1 = N_VGetArrayPointer(in_RCX);
  N_VScale(0x3ff0000000000000,in_RDX,in_RCX);
  for (local_5c = 0; local_5c < 10; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < 10; local_60 = local_60 + 1) {
      SUNDlsMat_denseGETRS
                (*(undefined8 *)(in_R9 + (long)local_5c * 0x50 + (long)local_60 * 8),2,
                 *(undefined8 *)(in_R9 + 0x640 + (long)local_5c * 0x50 + (long)local_60 * 8),
                 lVar1 + (long)(local_5c * 2 + local_60 * 0x14) * 8);
    }
  }
  return 0;
}

Assistant:

static int PSolve(sunrealtype tn, N_Vector u, N_Vector fu, N_Vector r, N_Vector z,
                  sunrealtype gamma, sunrealtype delta, int lr, void* user_data)
{
  sunrealtype**(*P)[MY];
  sunindextype*(*pivot)[MY];
  int jx, jy;
  sunrealtype *zdata, *v;
  UserData data;

  /* Extract the P and pivot arrays from user_data. */

  data  = (UserData)user_data;
  P     = data->P;
  pivot = data->pivot;
  zdata = N_VGetArrayPointer(z);

  N_VScale(ONE, r, z);

  /* Solve the block-diagonal system Px = r using LU factors stored
     in P and pivot data in pivot, and return the solution in z. */

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      v = &(IJKth(zdata, 1, jx, jy));
      SUNDlsMat_denseGETRS(P[jx][jy], NUM_SPECIES, pivot[jx][jy], v);
    }
  }

  return (0);
}